

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O3

bool isRemainingAllZero(Block *block,uint startIndex)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  uint j;
  
  bVar2 = true;
  if (startIndex < 0x40) {
    uVar1 = (ulong)startIndex;
    if ((*block)[""[startIndex]] == 0) {
      do {
        uVar3 = uVar1;
        if ((int)uVar3 == 0x3f) break;
        uVar1 = uVar3 + 1;
      } while ((*block)[""[uVar3 + 1]] == 0);
      return 0x3e < uVar3;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isRemainingAllZero(const Block& block, uint startIndex) {
    bool isAllZero = true; //judge if all other pixels that follow are zero
    for(uint j = startIndex; j < 64; j++) {
        if(block[ZIG_ZAG[j]] != 0) {
            isAllZero = false;
            break;
        }
    }
    return isAllZero;
}